

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *pNode)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  if (0 < (pNode->vFanouts).nSize) {
    lVar8 = 0;
    do {
      plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar8]];
      lVar3 = *plVar2;
      uVar1 = *(uint *)(plVar2 + 2);
      uVar4 = *(uint *)(lVar3 + 0xe4);
      if ((int)uVar1 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      else {
        uVar6 = (long)(int)uVar1 + 1;
        iVar7 = *(int *)(lVar3 + 0xe0);
        if ((int)uVar1 < iVar7 * 2) {
          if (iVar7 <= (int)uVar1) {
            if (*(void **)(lVar3 + 0xe8) == (void *)0x0) {
              pvVar5 = malloc((long)iVar7 << 3);
            }
            else {
              pvVar5 = realloc(*(void **)(lVar3 + 0xe8),(long)iVar7 << 3);
            }
            *(void **)(lVar3 + 0xe8) = pvVar5;
            iVar7 = iVar7 * 2;
LAB_0083b0b5:
            if (pvVar5 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *(int *)(lVar3 + 0xe0) = iVar7;
            uVar4 = *(uint *)(lVar3 + 0xe4);
          }
        }
        else if (iVar7 <= (int)uVar1) {
          if (*(void **)(lVar3 + 0xe8) == (void *)0x0) {
            pvVar5 = malloc(uVar6 * 4);
          }
          else {
            pvVar5 = realloc(*(void **)(lVar3 + 0xe8),uVar6 * 4);
          }
          *(void **)(lVar3 + 0xe8) = pvVar5;
          iVar7 = (int)uVar6;
          goto LAB_0083b0b5;
        }
        if ((int)uVar4 <= (int)uVar1) {
          memset((void *)((long)(int)uVar4 * 4 + *(long *)(lVar3 + 0xe8)),0,
                 (ulong)(uVar1 - uVar4) * 4 + 4);
        }
        *(int *)(lVar3 + 0xe4) = (int)uVar6;
      }
      if (((int)uVar1 < 0) || ((int)uVar6 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)(*(long *)(lVar3 + 0xe8) + (ulong)uVar1 * 4) == *(int *)(*plVar2 + 0xd8)) {
        if ((long)*(int *)((long)plVar2 + 0x1c) < 1) {
LAB_0083b194:
          __assert_fail("iFanin >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                        ,0x4ec,"int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *)");
        }
        uVar6 = 0;
        while (*(int *)(plVar2[4] + uVar6 * 4) != pNode->Id) {
          uVar6 = uVar6 + 1;
          if ((long)*(int *)((long)plVar2 + 0x1c) == uVar6) goto LAB_0083b194;
        }
        if (1 < uVar6) {
          __assert_fail("i >=0 && i < 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x17d,"int Abc_ObjFaninC(Abc_Obj_t *, int)");
        }
        if ((*(uint *)((long)plVar2 + 0x14) & (uint)(uVar6 != 0) * 0x400 + 0x400) != 0) {
          return 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pNode->vFanouts).nSize);
  }
  return 0;
}

Assistant:

int Abc_AigNodeHasComplFanoutEdgeTrav( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i, iFanin;
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            continue;
        iFanin = Vec_IntFind( &pFanout->vFanins, pNode->Id );
        assert( iFanin >= 0 );
        if ( Abc_ObjFaninC( pFanout, iFanin ) )
            return 1;
    }
    return 0;
}